

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool crnlib::rg_etc1::etc1_block::unpack_color5
               (uint *r,uint *g,uint *b,uint16 packed_color5,uint16 packed_delta3,bool scaled,
               uint alpha)

{
  bool bVar1;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_2c;
  bool success;
  color_quad_u8 result;
  bool scaled_local;
  uint16 packed_delta3_local;
  uint16 packed_color5_local;
  uint *b_local;
  uint *g_local;
  uint *r_local;
  
  success = scaled;
  result.field_0.m_u32._0_2_ = packed_delta3;
  result.field_0.m_u32._2_2_ = packed_color5;
  color_quad_u8::color_quad_u8((color_quad_u8 *)&local_2c.field_0);
  bVar1 = unpack_color5((color_quad_u8 *)&local_2c.field_0,result.field_0.m_u32._2_2_,
                        result.field_0.m_u32._0_2_,(bool)(success & 1),alpha);
  *r = (uint)local_2c.field_0.r;
  *g = (uint)local_2c.field_0.g;
  *b = (uint)local_2c.field_0.b;
  return bVar1;
}

Assistant:

bool etc1_block::unpack_color5(uint& r, uint& g, uint& b, uint16 packed_color5, uint16 packed_delta3, bool scaled, uint alpha)
        {
            color_quad_u8 result;
            const bool success = unpack_color5(result, packed_color5, packed_delta3, scaled, alpha);
            r = result.r;
            g = result.g;
            b = result.b;
            return success;
        }